

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_ARRAY::Save
          (_Type_ARRAY *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  uint uVar2;
  Object *pOVar3;
  char *pcVar4;
  ostream *poVar5;
  long *plVar6;
  offset_in_Memory_to_subr in_R8;
  Array *local_f0;
  Array *local_a8;
  undefined1 local_88 [28];
  uint sz_1;
  uint i_1;
  undefined1 local_60 [24];
  uint sz;
  uint i;
  Array *obj;
  offset_in_Memory_to_subr caller_local;
  Memory *local_30;
  Object *object_local;
  ostream *stream_local;
  _Type_ARRAY *this_local;
  
  obj = (Array *)caller;
  caller_local = in_R8;
  local_30 = (Memory *)object;
  object_local = (Object *)stream;
  stream_local = (ostream *)this;
  this_local = (_Type_ARRAY *)caller;
  _sz = Object::GetData<LiteScript::Array>(object);
  pOVar1 = object_local;
  uVar2 = Array::UnamedCount(_sz);
  OStreamer::Write<unsigned_int>((ostream *)pOVar1,uVar2);
  local_60._20_4_ = 0;
  local_60._16_4_ = Array::UnamedCount(_sz);
  for (; pOVar1 = object_local, (uint)local_60._20_4_ < (uint)local_60._16_4_;
      local_60._20_4_ = local_60._20_4_ + 1) {
    plVar6 = (long *)((long)(((Memory *)(local_30->arr)._M_elems[4])->arr)._M_elems + caller_local);
    if (((ulong)obj & 1) == 0) {
      local_a8 = obj;
    }
    else {
      local_a8 = *(Array **)((long)obj + *plVar6 + -1);
    }
    Array::ConstantGet((Array *)local_60,(uint)_sz);
    pOVar3 = Variable::operator->((Variable *)local_60);
    (*(code *)local_a8)(plVar6,pOVar1,pOVar3->ID);
    Variable::~Variable((Variable *)local_60);
  }
  uVar2 = Array::UnamedCount(_sz);
  OStreamer::Write<unsigned_int>((ostream *)pOVar1,uVar2);
  local_88._24_4_ = 0;
  local_88._20_4_ = Array::NamedCount(_sz);
  for (; pOVar1 = object_local, (uint)local_88._24_4_ < (uint)local_88._20_4_;
      local_88._24_4_ = local_88._24_4_ + 1) {
    pcVar4 = Array::GetNamedKey(_sz,local_88._24_4_);
    poVar5 = std::operator<<((ostream *)pOVar1,pcVar4);
    std::operator<<(poVar5,'\0');
    pOVar1 = object_local;
    plVar6 = (long *)((long)(((Memory *)(local_30->arr)._M_elems[4])->arr)._M_elems + caller_local);
    if (((ulong)obj & 1) == 0) {
      local_f0 = obj;
    }
    else {
      local_f0 = *(Array **)((long)obj + *plVar6 + -1);
    }
    Array::GetNamedVariable((Array *)local_88,(uint)_sz);
    pOVar3 = Variable::operator->((Variable *)local_88);
    (*(code *)local_f0)(plVar6,pOVar1,pOVar3->ID);
    Variable::~Variable((Variable *)local_88);
  }
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Array& obj = object.GetData<Array>();
    OStreamer::Write<unsigned int>(stream, obj.UnamedCount());
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++)
        (object.memory.*caller)(stream, obj.ConstantGet(i)->ID);
    OStreamer::Write<unsigned int>(stream, obj.UnamedCount());
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++) {
        stream << obj.GetNamedKey(i) << (uint8_t)0;
        (object.memory.*caller)(stream, obj.GetNamedVariable(i)->ID);
    }
}